

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parallel_solve.cpp
# Opt level: O1

void __thiscall
Clasp::mt::ParallelSolve::ParallelSolve(ParallelSolve *this,ParallelSolveOptions *opts)

{
  uint32 uVar1;
  SharedData *this_00;
  
  SolveAlgorithm::SolveAlgorithm(&this->super_SolveAlgorithm,(SolveLimits *)opts);
  (this->super_SolveAlgorithm)._vptr_SolveAlgorithm = (_func_int **)&PTR__ParallelSolve_001eb238;
  this_00 = (SharedData *)operator_new(0x160);
  SharedData::SharedData(this_00);
  this->shared_ = this_00;
  this->thread_ = (ParallelHandler **)0x0;
  uVar1 = (opts->distribute).mode;
  (this->distribution_).super_Policy = (opts->distribute).super_Policy;
  (this->distribution_).mode = uVar1;
  this->maxRestarts_ = 0;
  *(uint *)&this->field_0x84 = *(uint *)&this->field_0x84 & 0xc0000000 | 0x400;
  *(uint *)&this->field_0x84 = (uint)opts->integrate & 0xc0000000 | 0x400;
  this->intFlags_ = 9;
  this->modeSplit_ = (opts->algorithm).mode == mode_split;
  setRestarts(this,(opts->restarts).maxR,&(opts->restarts).sched);
  setIntegrate(this,(uint)opts->integrate & 0xfffffff,SUB41(opts->integrate,3) >> 4 & 3);
  return;
}

Assistant:

ParallelSolve::ParallelSolve(const ParallelSolveOptions& opts)
	: SolveAlgorithm(opts.limit)
	, shared_(new SharedData)
	, thread_(0)
	, distribution_(opts.distribute)
	, maxRestarts_(0)
	, intGrace_(1024)
	, intTopo_(opts.integrate.topo)
	, intFlags_(ClauseCreator::clause_not_root_sat | ClauseCreator::clause_no_add)
	, modeSplit_(opts.algorithm.mode == ParallelSolveOptions::Algorithm::mode_split) {
	setRestarts(opts.restarts.maxR, opts.restarts.sched);
	setIntegrate(opts.integrate.grace, opts.integrate.filter);
}